

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O0

double __thiscall
VarianceSwapsHestonAnalyticalPricer::uiTerm
          (VarianceSwapsHestonAnalyticalPricer *this,double t1,double t2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 local_160 [16];
  undefined1 local_150 [8];
  complex<double> ui;
  undefined1 local_130 [8];
  complex<double> thirdTerm;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  double local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [8];
  complex<double> secondTerm;
  double local_b8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  complex<double> firstTerm;
  complex<double> D2;
  complex<double> D1;
  complex<double> C2;
  complex<double> C1;
  double ci;
  double Wi;
  double qtilde;
  double delta;
  double t2_local;
  double t1_local;
  VarianceSwapsHestonAnalyticalPricer *this_local;
  
  dVar1 = t2 - t1;
  dVar2 = qtildeTerm(this);
  dVar3 = wTerm(this,t1);
  C1._M_value._8_8_ = cTerm(this,t1);
  uVar4 = 0;
  functionCPrime(this,dVar1,0.0);
  uVar5 = 0;
  C1._M_value._0_8_ = uVar4;
  functionCSecond(this,dVar1,0.0);
  uVar4 = 0;
  C2._M_value._0_8_ = uVar5;
  functionDPrime(this,dVar1,0.0);
  uVar5 = 0;
  D1._M_value._0_8_ = uVar4;
  functionDSecond(this,dVar1,0.0);
  dVar1 = dVar3 + dVar3 + dVar2;
  local_b8 = (dVar2 + dVar3) * (dVar2 + dVar3) + dVar1;
  D2._M_value._0_8_ = uVar5;
  std::operator*(&local_b8,(complex<double> *)(D2._M_value + 8));
  local_b0._8_8_ = dVar1;
  std::operator*((complex<double> *)local_b0,(complex<double> *)(D2._M_value + 8));
  secondTerm._M_value._8_8_ = (double)C1._M_value._8_8_ * (double)C1._M_value._8_8_;
  local_a0._8_8_ = dVar1;
  std::operator/((complex<double> *)local_a0,(double *)(secondTerm._M_value + 8));
  local_e8 = dVar2 + dVar3;
  thirdTerm._M_value._8_8_ = 0x4000000000000000;
  firstTerm._M_value._0_8_ = dVar1;
  std::operator*((double *)(thirdTerm._M_value + 8),(complex<double> *)(C2._M_value + 8));
  local_118._8_8_ = dVar1;
  std::operator*((complex<double> *)local_118,(complex<double> *)(D2._M_value + 8));
  local_108._8_8_ = dVar1;
  std::operator-((complex<double> *)local_108,(complex<double> *)(firstTerm._M_value + 8));
  local_f8._8_8_ = dVar1;
  std::operator*(&local_e8,(complex<double> *)local_f8);
  local_e0._8_8_ = dVar1;
  std::operator/((complex<double> *)local_e0,(double *)(C1._M_value + 8));
  secondTerm._M_value._0_8_ = dVar1;
  std::operator*((complex<double> *)(C2._M_value + 8),(complex<double> *)(C2._M_value + 8));
  std::operator-((complex<double> *)(ui._M_value + 8),(complex<double> *)(D1._M_value + 8));
  thirdTerm._M_value._0_8_ = dVar1;
  std::operator+((complex<double> *)local_90,(complex<double> *)local_d0);
  local_160._8_8_ = dVar1;
  std::operator+((complex<double> *)local_160,(complex<double> *)local_130);
  ui._M_value._0_8_ = dVar1;
  dVar1 = std::complex<double>::real_abi_cxx11_((complex<double> *)local_150);
  return dVar1;
}

Assistant:

double VarianceSwapsHestonAnalyticalPricer::
uiTerm(double t1, double t2) const {
    double delta = t2-t1,
           qtilde = qtildeTerm(),
           Wi = wTerm(t1),
           ci = cTerm(t1);
    std::complex<double> C1 = functionCPrime(delta,0.),
           C2 = functionCSecond(delta,0.),
           D1 = functionDPrime(delta,0.),
           D2 = functionDSecond(delta,0.);
    std::complex<double> firstTerm = (qtilde+2*Wi+(qtilde + Wi)*(qtilde + Wi)) 
                                        *D1*D1/(ci*ci),
                        secondTerm = (qtilde+Wi)*(2.0*C1*D1 - D2) / ci,
                        thirdTerm= C1*C1 - C2;
    std::complex<double> ui = firstTerm+secondTerm+thirdTerm;
    return ui.real();
}